

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void hta::
     throw_exception<hta::Exception,char_const*,std::chrono::duration<long,std::ratio<1l,1000000000l>>,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
               (char *args,duration<long,_std::ratio<1L,_1000000000L>_> args_1,char *args_2,
               time_point args_3,char *args_4,time_point args_5)

{
  Exception *this;
  string local_210;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_1e0;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_1d8;
  rep local_1d0;
  make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
  local_1c1;
  stringstream local_1c0 [8];
  stringstream msg;
  char *args_local_4;
  char *args_local_2;
  char *args_local;
  time_point args_local_5;
  time_point args_local_3;
  duration<long,_std::ratio<1L,_1000000000L>_> args_local_1;
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  local_1e0.__d.__r =
       (duration)
       (duration)
       args_5.
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  local_1d8.__d.__r =
       (duration)
       (duration)
       args_3.
       super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
       __r;
  local_1d0 = args_1.__r;
  detail::
  make_exception<const_char_*,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_const_char_*,_hta::Clock::time_point,_const_char_*,_hta::Clock::time_point>
  ::operator()(&local_1c1,(stringstream *)local_1c0,args,args_1,args_2,args_3,args_4,args_5);
  this = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  Exception::Exception(this,&local_210);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}